

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void highbd_convolve_horiz
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h,int bd)

{
  uint16_t uVar1;
  int bd_00;
  int16_t *b;
  long in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int sum;
  int16_t *x_filter;
  uint16_t *src_x;
  int in_stack_00000018;
  int x;
  int x_q4;
  int y;
  uint16_t *dst;
  uint16_t *src;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = CONCAT62(in_register_00000012,in_DX) << 1;
  local_38 = in_RDI * 2 + -6;
  for (local_44 = 0; local_44 < in_stack_00000018; local_44 = local_44 + 1) {
    local_48 = in_R9D;
    for (local_4c = 0; local_4c < (int)src_x; local_4c = local_4c + 1) {
      b = (int16_t *)(in_R8 + (long)(int)(local_48 & 0xf) * 0x10);
      bd_00 = highbd_horz_scalar_product((uint16_t *)(local_38 + (long)((int)local_48 >> 4) * 2),b);
      uVar1 = clip_pixel_highbd((int)b,bd_00);
      *(uint16_t *)(local_40 + (long)local_4c * 2) = uVar1;
      local_48 = (int)x_filter + local_48;
    }
    local_38 = in_RSI * 2 + local_38;
    local_40 = in_RCX * 2 + local_40;
  }
  return;
}

Assistant:

static void highbd_convolve_horiz(const uint8_t *src8, ptrdiff_t src_stride,
                                  uint8_t *dst8, ptrdiff_t dst_stride,
                                  const InterpKernel *x_filters, int x0_q4,
                                  int x_step_q4, int w, int h, int bd) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int sum = highbd_horz_scalar_product(src_x, x_filter);
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}